

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

Orphan<capnp::List<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>_> * __thiscall
capnp::compiler::Compiler::Impl::getAllSourceInfo
          (Orphan<capnp::List<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>_>
           *__return_storage_ptr__,Impl *this,Orphanage orphanage)

{
  uint index;
  __node_base *p_Var1;
  BuilderFor<capnp::List<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>_> builder;
  Orphanage local_58;
  Builder local_48;
  
  local_58.capTable = orphanage.capTable;
  local_58.arena = orphanage.arena;
  Orphanage::newOrphan<capnp::List<capnp::schema::Node::SourceInfo,(capnp::Kind)3>>
            (__return_storage_ptr__,&local_58,(uint)(this->sourceInfoById)._M_h._M_element_count);
  capnp::_::
  OrphanGetImpl<capnp::List<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>,_(capnp::Kind)6>::apply
            (&local_48,&__return_storage_ptr__->builder);
  p_Var1 = &(this->sourceInfoById)._M_h._M_before_begin;
  index = 0;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    List<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>::Builder::setWithCaveats
              (&local_48,index,(Reader *)(p_Var1 + 2));
    index = index + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<List<schema::Node::SourceInfo>> Compiler::Impl::getAllSourceInfo(Orphanage orphanage) {
  auto result = orphanage.newOrphan<List<schema::Node::SourceInfo>>(sourceInfoById.size());

  auto builder = result.get();
  size_t i = 0;
  for (auto& entry: sourceInfoById) {
    builder.setWithCaveats(i++, entry.second);
  }

  return result;
}